

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemWatcher_inotify.cpp
# Opt level: O0

void __thiscall FileSystemWatcher::clear(FileSystemWatcher *this)

{
  int __fd;
  bool bVar1;
  pointer ppVar2;
  iterator local_38;
  _Rb_tree_const_iterator<std::pair<const_Path,_int>_> local_30;
  iterator local_28;
  _Rb_tree_const_iterator<std::pair<const_Path,_int>_> local_20;
  const_iterator it;
  lock_guard<std::mutex> lock;
  FileSystemWatcher *this_local;
  
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&it,&this->mMutex);
  local_28._M_node =
       (_Base_ptr)
       std::map<Path,_int,_std::less<Path>,_std::allocator<std::pair<const_Path,_int>_>_>::begin
                 (&(this->mWatchedByPath).
                   super_map<Path,_int,_std::less<Path>,_std::allocator<std::pair<const_Path,_int>_>_>
                 );
  std::_Rb_tree_const_iterator<std::pair<const_Path,_int>_>::_Rb_tree_const_iterator
            (&local_20,&local_28);
  while( true ) {
    local_38._M_node =
         (_Base_ptr)
         std::map<Path,_int,_std::less<Path>,_std::allocator<std::pair<const_Path,_int>_>_>::end
                   (&(this->mWatchedByPath).
                     super_map<Path,_int,_std::less<Path>,_std::allocator<std::pair<const_Path,_int>_>_>
                   );
    std::_Rb_tree_const_iterator<std::pair<const_Path,_int>_>::_Rb_tree_const_iterator
              (&local_30,&local_38);
    bVar1 = std::operator!=(&local_20,&local_30);
    if (!bVar1) break;
    __fd = this->mFd;
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_Path,_int>_>::operator->(&local_20);
    inotify_rm_watch(__fd,ppVar2->second);
    std::_Rb_tree_const_iterator<std::pair<const_Path,_int>_>::operator++(&local_20);
  }
  std::map<Path,_int,_std::less<Path>,_std::allocator<std::pair<const_Path,_int>_>_>::clear
            (&(this->mWatchedByPath).
              super_map<Path,_int,_std::less<Path>,_std::allocator<std::pair<const_Path,_int>_>_>);
  std::map<int,_Path,_std::less<int>,_std::allocator<std::pair<const_int,_Path>_>_>::clear
            (&(this->mWatchedById).
              super_map<int,_Path,_std::less<int>,_std::allocator<std::pair<const_int,_Path>_>_>);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&it);
  return;
}

Assistant:

void FileSystemWatcher::clear()
{
    std::lock_guard<std::mutex> lock(mMutex);
    for (Map<Path, int>::const_iterator it = mWatchedByPath.begin(); it != mWatchedByPath.end(); ++it) {
        inotify_rm_watch(mFd, it->second);
    }
    mWatchedByPath.clear();
    mWatchedById.clear();
}